

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Wrapper * __thiscall Am_Value_List_Data::Make_Unique(Am_Value_List_Data *this)

{
  bool bVar1;
  Am_Value_List_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

Am_Value_List_Data::Am_Value_List_Data()
{
  head = nullptr;
  tail = nullptr;
  number = 0;
}